

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O2

void __thiscall S2Cell::S2Cell(S2Cell *this,S2CellId id)

{
  int iVar1;
  int orientation;
  int ij [2];
  int8 local_54 [4];
  int local_50;
  int local_4c;
  S2CellId local_48;
  R2Rect local_40;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_003047c0;
  (this->uv_).bounds_[0].bounds_.c_[0] = 1.0;
  (this->uv_).bounds_[0].bounds_.c_[1] = 0.0;
  (this->uv_).bounds_[1].bounds_.c_[0] = 1.0;
  (this->uv_).bounds_[1].bounds_.c_[1] = 0.0;
  (this->id_).id_ = id.id_;
  local_48.id_ = id.id_;
  iVar1 = S2CellId::ToFaceIJOrientation(&local_48,&local_50,&local_4c,(int *)local_54);
  this->face_ = (int8)iVar1;
  this->orientation_ = local_54[0];
  iVar1 = S2CellId::level(&local_48);
  this->level_ = (char)iVar1;
  S2CellId::IJLevelToBoundUV(&local_40,&local_50,(int)(char)iVar1);
  (this->uv_).bounds_[1].bounds_.c_[0] = local_40.bounds_[1].bounds_.c_[0];
  (this->uv_).bounds_[1].bounds_.c_[1] = local_40.bounds_[1].bounds_.c_[1];
  (this->uv_).bounds_[0].bounds_.c_[0] = local_40.bounds_[0].bounds_.c_[0];
  (this->uv_).bounds_[0].bounds_.c_[1] = local_40.bounds_[0].bounds_.c_[1];
  return;
}

Assistant:

S2Cell::S2Cell(S2CellId id) {
  id_ = id;
  int ij[2], orientation;
  face_ = id.ToFaceIJOrientation(&ij[0], &ij[1], &orientation);
  orientation_ = orientation;  // Compress int to a byte.
  level_ = id.level();
  uv_ = S2CellId::IJLevelToBoundUV(ij, level_);
}